

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pboolean p_socket_init_once(void)

{
  signal(0xd,(__sighandler_t)0x1);
  return 1;
}

Assistant:

pboolean
p_socket_init_once (void)
{
#ifdef P_OS_WIN
	WORD	ver_req;
	WSADATA	wsa_data;

	ver_req = MAKEWORD (2, 2);

	if (P_UNLIKELY (WSAStartup (ver_req, &wsa_data) != 0))
		return FALSE;

	if (P_UNLIKELY (LOBYTE (wsa_data.wVersion) != 2 || HIBYTE (wsa_data.wVersion) != 2)) {
		WSACleanup ();
		return FALSE;
	}
#else
#  ifdef SIGPIPE
	signal (SIGPIPE, SIG_IGN);
#  endif
#endif
	return TRUE;
}